

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::disablei(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_31;
  string local_30;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "GL_INVALID_ENUM is generated if cap is not one of the allowed values.",&local_31);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    glu::CallLogWrapper::glDisablei(&ctx->super_CallLogWrapper,0xffffffff,0xffffffff);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "GL_INVALID_VALUE is generated  if index is greater than or equal to the number of indexed capabilities for cap."
               ,&local_31);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    glu::CallLogWrapper::glDisablei(&ctx->super_CallLogWrapper,0xbe2,0xffffffff);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x75);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void disablei (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	ctx.beginSection("GL_INVALID_ENUM is generated if cap is not one of the allowed values.");
	ctx.glDisablei(-1,-1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated  if index is greater than or equal to the number of indexed capabilities for cap.");
	ctx.glDisablei(GL_BLEND, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}